

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.c
# Opt level: O2

int generate_by_descriptor_sh
              (miniscript_node_t *node,miniscript_node_t *parent,int32_t derive_child_num,
              uchar *script,size_t script_len,size_t *write_len)

{
  int iVar1;
  int iVar2;
  size_t child_write_len;
  uchar buf [23];
  
  child_write_len = *write_len;
  iVar1 = -2;
  iVar2 = iVar1;
  if (((0x16 < script_len && node->child != (miniscript_node_t *)0x0) &&
      (((parent == (miniscript_node_t *)0x0 || (parent->info != (miniscript_item_t *)0x0)) &&
       (iVar2 = generate_script_from_miniscript
                          (node->child,node,derive_child_num,script,script_len,&child_write_len),
       iVar2 == 0)))) &&
     ((iVar2 = iVar1, child_write_len < 0x209 &&
      (iVar2 = wally_scriptpubkey_p2sh_from_bytes(script,child_write_len,1,buf,0x17,write_len),
      iVar2 == 0)))) {
    memcpy(script,buf,*write_len);
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

static int generate_by_descriptor_sh(
    struct miniscript_node_t *node,
    struct miniscript_node_t *parent,
    int32_t derive_child_num,
    unsigned char *script,
    size_t script_len,
    size_t *write_len)
{
    int ret;
    size_t child_write_len = *write_len;
    unsigned char buf[WALLY_SCRIPTPUBKEY_P2SH_LEN];
    if (!node->child || (script_len < WALLY_SCRIPTPUBKEY_P2SH_LEN) || (parent && !parent->info))
        return WALLY_EINVAL;

    ret = generate_script_from_miniscript(node->child, node, derive_child_num, script, script_len, &child_write_len);
    if (ret != WALLY_OK)
        return ret;

    if (child_write_len > DESCRIPTOR_REDEEM_SCRIPT_MAX_SIZE)
        return WALLY_EINVAL;

    ret = wally_scriptpubkey_p2sh_from_bytes(script, child_write_len, WALLY_SCRIPT_HASH160, buf, WALLY_SCRIPTPUBKEY_P2SH_LEN, write_len);
    if (ret == WALLY_OK)
        memcpy(script, buf, *write_len);

    return ret;
}